

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

Err * vm_run_file(VM *vm,char *path)

{
  int pkg;
  uint64_t name;
  char *pcVar1;
  Err *pEVar2;
  int ins_idx;
  
  name = extract_pkg_name(path);
  if (name == 0xffffffffffffffff) {
    pcVar1 = "invalid package name from file path `%s`";
  }
  else {
    pcVar1 = read_file(path);
    if (pcVar1 != (char *)0x0) {
      pkg = vm_new_pkg(vm,name);
      pEVar2 = parse(vm,pkg,path,pcVar1);
      free(pcVar1);
      if (pEVar2 != (Err *)0x0) {
        return pEVar2;
      }
      vm_run(vm,vm->pkgs[pkg].main_fn,ins_idx);
      return (Err *)0x0;
    }
    pcVar1 = "failed to open file `%s`";
  }
  pEVar2 = err_new(pcVar1,path);
  err_file(pEVar2,path);
  return pEVar2;
}

Assistant:

Err * vm_run_file(VM *vm, char *path) {
	// TODO: save and restore VM state in case of error

	// Extract the package name from the file path
	uint64_t name = extract_pkg_name(path);
	if (name == ~((uint64_t) 0)) {
		Err *err = err_new("invalid package name from file path `%s`", path);
		err_file(err, path);
		return err;
	}

	// Read the file contents
	char *code = read_file(path);
	if (code == NULL) {
		Err *err = err_new("failed to open file `%s`", path);
		err_file(err, path);
		return err;
	}

	// Parse the source code
	int pkg = vm_new_pkg(vm, name);
	Err *err = parse(vm, pkg, path, code);
	free(code);
	if (err != NULL) {
		return err;
	}

	// Run the code
	return vm_run(vm, vm->pkgs[pkg].main_fn, 0);
}